

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O2

int __thiscall
asmjit::CodeBuilder::bind(CodeBuilder *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  Error EVar1;
  undefined4 in_register_00000034;
  CBLabel *node;
  CBLabel *local_10;
  
  EVar1 = (this->super_CodeEmitter)._lastError;
  if (EVar1 != 0) {
    return EVar1;
  }
  EVar1 = getCBLabel(this,&local_10,*(uint32_t *)(CONCAT44(in_register_00000034,__fd) + 4));
  if (EVar1 == 0) {
    addNode(this,&local_10->super_CBNode);
    EVar1 = 0;
  }
  else {
    EVar1 = CodeEmitter::setLastError(&this->super_CodeEmitter,EVar1,(char *)0x0);
  }
  return EVar1;
}

Assistant:

Error CodeBuilder::bind(const Label& label) {
  if (_lastError) return _lastError;

  CBLabel* node;
  Error err = getCBLabel(&node, label);
  if (ASMJIT_UNLIKELY(err))
    return setLastError(err);

  addNode(node);
  return kErrorOk;
}